

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall
CTcTokenizer::xlat_escape(CTcTokenizer *this,utf8_ptr *dst,utf8_ptr *p,wchar_t qu,int triple)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t in_ECX;
  int in_R8D;
  long new_acc;
  wchar_t cur;
  int acc;
  int i;
  wchar_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_28;
  int local_24;
  
  utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  wVar1 = utf8_ptr::getch((utf8_ptr *)0x2e73e0);
  switch(wVar1) {
  case L' ':
    break;
  default:
    log_pedantic(0x2752,(ulong)(uint)wVar1);
    utf8_ptr::setch((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac);
    break;
  case L'\"':
  case L'\'':
    if ((in_R8D != 0) && (wVar1 == in_ECX)) {
      while (wVar1 = utf8_ptr::getch((utf8_ptr *)0x2e743a), wVar1 == in_ECX) {
        utf8_ptr::setch((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac);
        utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      }
      return;
    }
    break;
  case L'0':
  case L'1':
  case L'2':
  case L'3':
  case L'4':
  case L'5':
  case L'6':
  case L'7':
    local_24 = 0;
    local_28 = 0;
    while (local_24 < 3) {
      wVar1 = utf8_ptr::getch((utf8_ptr *)0x2e7562);
      iVar2 = is_odigit(L'\0');
      if (iVar2 == 0) break;
      iVar2 = value_of_odigit(wVar1);
      local_28 = local_28 * 8 + iVar2;
      if (0xff < local_28) break;
      local_24 = local_24 + 1;
      utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
    utf8_ptr::setch((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac);
    return;
  case L'<':
  case L'>':
  case L'\\':
    break;
  case L'^':
    break;
  case L'b':
    break;
  case L'n':
    break;
  case L'r':
    break;
  case L't':
    break;
  case L'u':
    local_24 = 0;
    utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    while (local_24 < 4) {
      wVar1 = utf8_ptr::getch((utf8_ptr *)0x2e74df);
      iVar2 = is_xdigit(L'\0');
      if (iVar2 == 0) break;
      value_of_xdigit(wVar1);
      local_24 = local_24 + 1;
      utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
    utf8_ptr::setch((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac);
    return;
  case L'v':
    break;
  case L'x':
    local_24 = 0;
    local_28 = 0;
    utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    while (local_24 < 2) {
      wVar1 = utf8_ptr::getch((utf8_ptr *)0x2e7608);
      iVar2 = is_xdigit(L'\0');
      if (iVar2 == 0) break;
      in_stack_ffffffffffffffb4 = local_28 << 4;
      local_28 = value_of_xdigit(wVar1);
      local_28 = in_stack_ffffffffffffffb4 + local_28;
      local_24 = local_24 + 1;
      utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
    utf8_ptr::setch((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac);
    return;
  }
  utf8_ptr::setch((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  in_stack_ffffffffffffffac);
  utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void CTcTokenizer::xlat_escape(utf8_ptr *dst, utf8_ptr *p,
                               wchar_t qu, int triple)
{
    int i, acc;
    
    /* get the character after the escape */
    p->inc();
    wchar_t cur = p->getch();

    /* see what we have */
    switch(cur)
    {
    case '^':
        /* caps - 0x000F */
        cur = 0x000F;
        break;
        
    case '"':
    case '\'':
        /* 
         *   If we're in triple-quote mode, and this is the matching quote, a
         *   single backslash escapes a whole run of consecutive quotes, so
         *   skip the whole run.  
         */
        if (triple && cur == qu)
        {
            /* copy and skip all consecutive quotes */
            for ( ; p->getch() == qu ; dst->setch(cur), p->inc()) ;
            
            /* we're done */
            return;
        }
        break;
        
    case 'v':
        /* miniscules - 0x000E */
        cur = 0x000E;
        break;
        
    case 'b':
        /* blank line - 0x000B */
        cur = 0x000B;
        break;
        
    case ' ':
        /* quoted space - 0x0015 */
        cur = 0x0015;
        break;

    case 'n':
        /* newline - explicitly use Unicode 10 character */
        cur = 10;
        break;

    case 'r':
        /* return - explicitly use Unicode 13 character */
        cur = 13;
        break;

    case 't':
        /* tab - explicitly use Unicode 9 character */
        cur = 9;
        break;

    case 'u':
        /* 
         *   Hex unicode character number.  Read up to 4 hex digits that
         *   follow the 'u', and use that as a Unicode character ID.  
         */
        for (i = 0, acc = 0, p->inc() ; i < 4 ; ++i, p->inc())
        {
            /* get the next character */
            cur = p->getch();
            
            /* 
             *   if it's another hex digit, add it into the accumulator;
             *   otherwise, we're done 
             */
            if (is_xdigit(cur))
                acc = 16*acc + value_of_xdigit(cur);
            else
                break;
        }
        
        /* use the accumulated value as the character number */
        dst->setch((wchar_t)acc);
        
        /* we've already skipped ahead to the next character, so we're done */
        return;
        
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
        /* 
         *   Octal ASCII character number.  Accumulate up to three octal
         *   numbers, and use the result as a character ID. 
         */
        for (i = 0, acc = 0 ; i < 3 ; ++i, p->inc())
        {
            /* get the next character */
            cur = p->getch();
            
            /* 
             *   if it's another digit, and it would leave our result in the
             *   0-255 range, count it; if not, we're done 
             */
            if (is_odigit(cur))
            {
                /* compute the new value */
                long new_acc = 8*acc + value_of_odigit(cur);
                
                /* if this would be too high, don't count it */
                if (new_acc > 255)
                    break;
                else
                    acc = new_acc;
            }
            else
                break;
        }
        
        /* use the accumulated value as the character number */
        dst->setch((wchar_t)acc);
        
        /* 
         *   continue with the current character, since we've already skipped
         *   ahead to the next one 
         */
        return;

    case 'x':
        /* 
         *   Hex ASCII character number.  Read up to two hex digits as a
         *   character number.
         */
        for (i = 0, acc = 0, p->inc() ; i < 2 ; ++i, p->inc())
        {
            /* get the next character */
            cur = p->getch();
            
            /* 
             *   if it's another hex digit, add it into the accumulator;
             *   otherwise, we're done 
             */
            if (is_xdigit(cur))
                acc = 16*acc + value_of_xdigit(cur);
            else
                break;
        }
        
        /* use the accumulated value as the character number */
        dst->setch((wchar_t)acc);
        
        /* 
         *   continue with the current character, since we've already skipped
         *   ahead to the next one 
         */
        return;
        
    case '<':
    case '>':
    case '\\':
        /* just copy these literally */
        break;
        
    default:
        /* log a pedantic error */
        log_pedantic(TCERR_BACKSLASH_SEQ, cur);
        
        /* copy anything else as-is, including the backslash */
        dst->setch('\\');
        break;
    }

    /* set the output character */
    dst->setch(cur);

    /* skip the current character */
    p->inc();
}